

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

void __thiscall cppcms::impl::url_rewriter::url_rewriter(url_rewriter *this,array *ar)

{
  string *psVar1;
  vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *in_RSI;
  rule *in_RDI;
  bool final;
  string p;
  string r;
  size_t i;
  value_type *in_stack_ffffffffffffff18;
  rule *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  rule *path;
  value *in_stack_ffffffffffffff48;
  size_type in_stack_ffffffffffffff58;
  vector<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
  *in_stack_ffffffffffffff60;
  string local_68 [32];
  string local_48 [23];
  undefined1 in_stack_ffffffffffffffcf;
  string *in_stack_ffffffffffffffd0;
  string *psVar2;
  string *r_00;
  rule *in_stack_ffffffffffffffe0;
  
  path = in_RDI;
  std::vector<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>::
  vector((vector<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
          *)0x10ecd1);
  std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::size(in_RSI);
  std::vector<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>::
  reserve(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  psVar2 = (string *)0x0;
  while( true ) {
    r_00 = psVar2;
    psVar1 = (string *)
             std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::size(in_RSI);
    if (psVar1 <= psVar2) break;
    std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::operator[]
              (in_RSI,(size_type)r_00);
    json::value::get<std::__cxx11::string>
              ((value *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               (char *)in_stack_ffffffffffffff20);
    std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::operator[]
              (in_RSI,(size_type)r_00);
    json::value::get<std::__cxx11::string>
              ((value *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               (char *)in_stack_ffffffffffffff20);
    std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::operator[]
              (in_RSI,(size_type)r_00);
    in_stack_ffffffffffffff20 = in_RDI;
    in_stack_ffffffffffffff2f =
         json::value::get<bool>(in_stack_ffffffffffffff48,(char *)path,(bool *)in_RDI);
    in_RDI = in_stack_ffffffffffffff20;
    rule::rule(in_stack_ffffffffffffffe0,r_00,in_stack_ffffffffffffffd0,
               (bool)in_stack_ffffffffffffffcf);
    std::vector<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
    ::push_back((vector<cppcms::impl::url_rewriter::rule,_std::allocator<cppcms::impl::url_rewriter::rule>_>
                 *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    rule::~rule(in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
    psVar2 = r_00 + 1;
  }
  return;
}

Assistant:

url_rewriter(json::array const &ar)
	{
		rules_.reserve(ar.size());
		for(size_t i=0;i<ar.size();i++) {
			std::string r = ar[i].get<std::string>("regex");
			std::string p = ar[i].get<std::string>("pattern");
			bool final = ar[i].get("final",true);
			rules_.push_back(rule(r,p,final));
		}
	}